

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O1

Solution * ConstructionHeuristics::randomIteration(Solution *solution)

{
  Turn *this;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  result_type rVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar6;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar7;
  Scenario *this_00;
  WeekData *this_01;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  string *psVar8;
  const_iterator cVar9;
  ShiftType *this_03;
  const_iterator cVar10;
  _Base_ptr p_Var11;
  long lVar12;
  int iVar13;
  pointer ppTVar14;
  ulong uVar15;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  type random;
  vector<Turn_*,_std::allocator<Turn_*>_> local_70;
  pointer local_58;
  vector<Turn_*,_std::allocator<Turn_*>_> *local_50;
  pointer local_48;
  param_type local_40;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  uVar3 = std::chrono::_V2::system_clock::now();
  pmVar6 = Solution::getNurses_abi_cxx11_(solution);
  local_40 = (param_type)
             (((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count << 0x20) + -0x100000000);
  local_38._M_x = (ulong)uVar3 % 0x7fffffff + (ulong)((ulong)uVar3 % 0x7fffffff == 0);
  pvVar7 = Solution::getTurns(solution);
  local_50 = (pvVar7->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pvVar7->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_50 != local_58) {
    do {
      std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&local_70,local_50);
      local_48 = local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppTVar14 = local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar2 = true;
      }
      else {
        do {
          this = *ppTVar14;
          this_00 = Scenario::getInstance();
          this_01 = Scenario::getWeekData(this_00);
          this_02 = &WeekData::getRequirements_abi_cxx11_(this_01)->_M_h;
          psVar8 = Turn::getSkill_abi_cxx11_(this);
          cVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(this_02,psVar8);
          if (cVar9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
LAB_00119e41:
            std::__throw_out_of_range("_Map_base::at");
LAB_00119e4d:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          this_03 = Turn::getShiftType(this);
          psVar8 = ShiftType::getId_abi_cxx11_(this_03);
          cVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((long)cVar9.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
                                    ._M_cur + 0x28),psVar8);
          if (cVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00119e41;
          uVar3 = Turn::getDay(this);
          if ((ulong)(*(long *)((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                      ._M_cur + 0x30) -
                      *(long *)((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                      ._M_cur + 0x28) >> 3) <= (ulong)uVar3) goto LAB_00119e4d;
          iVar4 = DayRequirement::getMinimumCoverage
                            (*(DayRequirement **)
                              (*(long *)((long)cVar10.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                               ._M_cur + 0x28) + (ulong)uVar3 * 8));
          bVar1 = 0 < iVar4;
          if (iVar4 < 1) {
            bVar2 = false;
          }
          else {
            uVar15 = 0;
            iVar13 = 0;
            do {
              pmVar6 = Solution::getNurses_abi_cxx11_(solution);
              p_Var11 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              rVar5 = std::uniform_int_distribution<int>::operator()
                                ((uniform_int_distribution<int> *)&local_40,&local_38,&local_40);
              lVar12 = (long)rVar5;
              if (rVar5 < 1) {
                if (rVar5 != 0) {
                  do {
                    p_Var11 = (_Base_ptr)std::_Rb_tree_decrement(p_Var11);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 0);
                }
              }
              else {
                do {
                  p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
                  lVar12 = lVar12 + -1;
                } while (lVar12 != 0);
              }
              bVar2 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(p_Var11 + 2),this);
              pmVar6 = Solution::getNurses_abi_cxx11_(solution);
              if ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 2 <= uVar15) {
                bVar2 = true;
                goto LAB_00119dd4;
              }
              uVar15 = uVar15 + 1;
              iVar13 = iVar13 + (uint)bVar2;
              bVar1 = iVar13 < iVar4;
            } while (iVar13 < iVar4);
            bVar2 = false;
          }
LAB_00119dd4:
          if (bVar1) goto LAB_00119dee;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != local_48);
        bVar2 = false;
LAB_00119dee:
        bVar2 = !bVar2;
      }
      if (local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar2) {
        return (Solution *)0x0;
      }
      local_50 = local_50 + 1;
    } while (local_50 != local_58);
  }
  return solution;
}

Assistant:

Solution* ConstructionHeuristics::randomIteration(Solution * solution) {
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}